

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

idx_t duckdb::HandleInsertConflicts<true>
                (TableCatalogEntry *table,ExecutionContext *context,InsertLocalState *lstate,
                InsertGlobalState *gstate,DataChunk *tuples,PhysicalInsert *op)

{
  DataChunk *input;
  ClientContext *context_00;
  ulong uVar1;
  _func_int **pp_Var2;
  data_ptr_t pdVar3;
  TableCatalogEntry *pTVar4;
  bool bVar5;
  int iVar6;
  pointer __p;
  undefined4 extraout_var;
  LocalStorage *this;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  ConstraintState *pCVar7;
  idx_t iVar8;
  ManagedSelection *pMVar9;
  TableCatalogEntry *table_01;
  pointer __p_00;
  DuckTransaction *transaction;
  type state;
  undefined4 extraout_var_00;
  reference pvVar10;
  reference pvVar11;
  const_reference pvVar12;
  TableDeleteState *state_00;
  type state_01;
  InternalException *this_00;
  pointer pVVar13;
  size_type __n;
  size_type __n_00;
  idx_t iVar14;
  __pthread_internal_list *p_Var15;
  ulong uVar16;
  optional_ptr<duckdb::ConflictManager,_true> manager;
  ulong uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  idx_t count_p;
  unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
  fetch_state;
  SelectionVector sel_vec;
  DataChunk conflict_condition_result;
  DataChunk combined_chunk;
  DataChunk conflict_chunk;
  DataChunk scan_chunk;
  ConflictInfo conflict_info;
  ConflictManager conflict_manager;
  __uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
  local_2e8;
  TableCatalogEntry *local_2e0;
  InsertGlobalState *local_2d8;
  ManagedSelection *local_2d0;
  undefined1 local_2c8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  SelectionVector local_2b0;
  SelectionVector *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_278;
  undefined1 local_270 [64];
  DataChunk local_230;
  DataChunk local_1f0;
  string local_1b0;
  DataChunk local_190;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_150;
  undefined1 local_148;
  ConflictManager local_140;
  DataTable *table_00;
  
  local_2d8 = gstate;
  iVar6 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])();
  table_00 = (DataTable *)CONCAT44(extraout_var,iVar6);
  this = LocalStorage::Get(context->client,table_00->db);
  local_148 = 1;
  local_150 = &op->conflict_target;
  ConflictManager::ConflictManager(&local_140,APPEND,tuples->count,(ConflictInfo *)&local_150);
  storage = LocalStorage::GetStorage(this,table_00);
  pCVar7 = InsertLocalState::GetConstraintState(lstate,table_00,table);
  manager.ptr = &local_140;
  DataTable::VerifyAppendConstraints(table_00,pCVar7,context->client,tuples,storage,manager);
  ConflictManager::Finalize(&local_140);
  iVar8 = ConflictManager::ConflictCount(&local_140);
  if (iVar8 == 0) {
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    pMVar9 = ConflictManager::Conflicts(&local_140);
    table_01 = (TableCatalogEntry *)ConflictManager::RowIds(&local_140);
    DataChunk::DataChunk(&local_1f0);
    DataChunk::DataChunk(&local_190);
    DataChunk::DataChunk((DataChunk *)(local_270 + 0x40));
    context_00 = context->client;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_2c8,tuples);
    DataChunk::Initialize
              (&local_1f0,context_00,(vector<duckdb::LogicalType,_true> *)local_2c8,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_2c8);
    DataChunk::Reference(&local_1f0,tuples);
    local_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pMVar9->sel_vec;
    DataChunk::Slice(&local_1f0,(SelectionVector *)local_278._M_pi,pMVar9->count);
    local_1f0.count = pMVar9->count;
    local_2e8._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
    .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl =
         (tuple<duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>)
         (_Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
          )0x0;
    local_2d0 = pMVar9;
    if ((op->types_to_fetch).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (op->types_to_fetch).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      DataChunk::Initialize(&local_190,context->client,&op->types_to_fetch,0x800);
      __p_00 = (pointer)operator_new(0x50);
      (__p_00->handles)._M_h._M_buckets = (__buckets_ptr)0x0;
      (__p_00->handles)._M_h._M_bucket_count = 0;
      *(undefined8 *)&(__p_00->handles)._M_h._M_rehash_policy = 0;
      (__p_00->handles)._M_h._M_rehash_policy._M_next_resize = 0;
      (__p_00->handles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p_00->handles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__p_00->handles)._M_h._M_element_count = 0;
      (__p_00->handles)._M_h._M_buckets = &(__p_00->handles)._M_h._M_single_bucket;
      (__p_00->handles)._M_h._M_bucket_count = 1;
      (__p_00->handles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__p_00->handles)._M_h._M_rehash_policy._M_next_resize = 0;
      (__p_00->handles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c8._0_8_ =
           (__uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
            )0x0;
      ::std::
      __uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
      reset(&local_2e8,__p_00);
      ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
      ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                   *)local_2c8);
      transaction = DuckTransaction::Get
                              (context->client,
                               (table->super_StandardEntry).super_InCatalogEntry.catalog);
      manager.ptr = (ConflictManager *)local_2d0->count;
      state = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
              ::operator*((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                           *)&local_2e8);
      DataTable::Fetch(table_00,transaction,&local_190,&op->columns_to_fetch,(Vector *)table_01,
                       (idx_t)manager.ptr,state);
    }
    CombineExistingAndInsertTuples
              ((DataChunk *)(local_270 + 0x40),&local_190,&local_1f0,context->client,op);
    pCVar7 = InsertLocalState::GetConstraintState(lstate,table_00,table);
    if ((op->on_conflict_condition).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      DataChunk::DataChunk((DataChunk *)local_270);
      CheckOnConflictCondition
                (context,(DataChunk *)(local_270 + 0x40),&op->on_conflict_condition,
                 (DataChunk *)local_270);
      bVar5 = AllConflictsMeetCondition((DataChunk *)local_270);
      if (!bVar5) {
        ManagedSelection::ManagedSelection((ManagedSelection *)local_2c8,local_230.count,true);
        pvVar10 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)local_270,0);
        if ((__pthread_internal_list *)local_230.count != (__pthread_internal_list *)0x0) {
          pdVar3 = pvVar10->data;
          p_Var15 = (__pthread_internal_list *)0x0;
          pVVar13 = (pointer)local_2c8._8_8_;
          do {
            if (pdVar3[(long)p_Var15] == '\0') {
              if (local_298 != (SelectionVector *)0x0) {
                *(int *)((long)&((((buffer_ptr<VectorBuffer> *)&local_298->sel_vector)->internal).
                                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_VectorBuffer + (long)pVVar13 * 4) = (int)p_Var15;
              }
              pVVar13 = (pointer)&pVVar13->field_0x1;
              local_2c8._8_8_ = pVVar13;
            }
            p_Var15 = (__pthread_internal_list *)((long)&p_Var15->__prev + 1);
          } while ((__pthread_internal_list *)local_230.count != p_Var15);
        }
        DataChunk::Slice((DataChunk *)(local_270 + 0x40),&local_2b0,local_2c8._8_8_);
        DataTable::VerifyAppendConstraints
                  (table_00,pCVar7,context->client,(DataChunk *)(local_270 + 0x40),
                   (optional_ptr<duckdb::LocalTableStorage,_true>)0x0,
                   (optional_ptr<duckdb::ConflictManager,_true>)0x0);
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"VerifyAppendConstraints was expected to throw but didn\'t",
                   "");
        InternalException::InternalException(this_00,&local_1b0);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      DataChunk::~DataChunk((DataChunk *)local_270);
    }
    if (&lstate->update_chunk == tuples) {
      RegisterUpdatedRows(lstate,(Vector *)table_01,local_230.count);
    }
    if (op->action_type == NOTHING) {
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      DataChunk::DataChunk((DataChunk *)local_2c8);
      CreateUpdateChunk(context,(DataChunk *)(local_270 + 0x40),table_01,(Vector *)local_2c8,
                        (DataChunk *)op,(PhysicalInsert *)manager.ptr);
      iVar6 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0x10])();
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        input = &lstate->append_chunk;
        (lstate->append_chunk).count = (idx_t)local_2b0.sel_vector;
        local_2e0 = (TableCatalogEntry *)CONCAT44(extraout_var_00,iVar6);
        if ((lstate->append_chunk).data.
            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (lstate->append_chunk).data.
            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start) {
          __n = 0;
          do {
            pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)(local_270 + 0x40),__n);
            Vector::Reference(pvVar10,pvVar11);
            __n = __n + 1;
          } while (__n < (ulong)(((long)(lstate->append_chunk).data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(lstate->append_chunk).data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x4ec4ec4ec4ec4ec5));
        }
        if ((op->set_columns).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (op->set_columns).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __n_00 = 0;
          do {
            pvVar12 = vector<duckdb::PhysicalIndex,_true>::operator[](&op->set_columns,__n_00);
            pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,pvVar12->index);
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)local_2c8,__n_00);
            Vector::Reference(pvVar10,pvVar11);
            __n_00 = __n_00 + 1;
          } while (__n_00 < (ulong)((long)(op->set_columns).
                                          super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                          .
                                          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(op->set_columns).
                                          super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                          .
                                          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        pTVar4 = local_2e0;
        if (op->update_is_del_and_insert == false) {
          if ((op->parallel == false) && (op->return_chunk == true)) {
            ColumnDataCollection::Append(&local_2d8->return_collection,input);
          }
          pTVar4 = local_2e0;
          DataTable::InitializeUpdate
                    ((DataTable *)local_270,local_2e0,(ClientContext *)table,
                     (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                      *)context->client);
          state_01 = unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
                     ::operator*((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
                                  *)local_270);
          DataTable::Update((DataTable *)pTVar4,state_01,context->client,(Vector *)table_01,
                            &op->set_columns,(DataChunk *)local_2c8);
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
          if ((tuple<duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>)
              local_270._0_8_ != (_Head_base<0UL,_duckdb::TableUpdateState_*,_false>)0x0) {
            ::std::default_delete<duckdb::TableUpdateState>::operator()
                      ((default_delete<duckdb::TableUpdateState> *)local_270,
                       (TableUpdateState *)local_270._0_8_);
          }
        }
        else {
          state_00 = InsertLocalState::GetDeleteState
                               (lstate,(DataTable *)local_2e0,table,context->client);
          DataTable::Delete((DataTable *)pTVar4,state_00,context->client,(Vector *)table_01,
                            (idx_t)local_2b0.sel_vector);
          if ((op->parallel == false) && (op->return_chunk == true)) {
            ColumnDataCollection::Append(&local_2d8->return_collection,input);
          }
          DataTable::LocalAppend
                    ((DataTable *)local_2e0,table,context->client,input,&op->bound_constraints,
                     (Vector *)table_01,input);
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
        }
      }
      DataChunk::~DataChunk((DataChunk *)local_2c8);
    }
    SelectionVector::SelectionVector((SelectionVector *)local_2c8,tuples->count);
    iVar8 = tuples->count;
    if (iVar8 == 0) {
      count_p = 0;
    }
    else {
      uVar1 = local_2d0->count;
      pp_Var2 = (local_278._M_pi)->_vptr__Sp_counted_base;
      iVar14 = 0;
      count_p = 0;
      uVar16 = 0;
      do {
        if (uVar16 < uVar1) {
          uVar17 = uVar16;
          if (pp_Var2 != (_func_int **)0x0) {
            uVar17 = (ulong)*(uint *)((long)pp_Var2 + uVar16 * 4);
          }
          if (iVar14 != uVar17) goto LAB_0158e356;
          uVar16 = uVar16 + 1;
        }
        else {
LAB_0158e356:
          *(int *)((long)&(((buffer_handle_set_t *)local_2c8._0_8_)->_M_h)._M_buckets + count_p * 4)
               = (int)iVar14;
          count_p = count_p + 1;
        }
        iVar14 = iVar14 + 1;
      } while (iVar8 != iVar14);
    }
    DataChunk::Slice(tuples,(SelectionVector *)local_2c8,count_p);
    tuples->count = count_p;
    if ((pointer)local_2b8._M_pi != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
    }
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                 *)&local_2e8);
    DataChunk::~DataChunk((DataChunk *)(local_270 + 0x40));
    DataChunk::~DataChunk(&local_190);
    DataChunk::~DataChunk(&local_1f0);
  }
  ConflictManager::~ConflictManager(&local_140);
  return (idx_t)p_Var18;
}

Assistant:

static idx_t HandleInsertConflicts(TableCatalogEntry &table, ExecutionContext &context, InsertLocalState &lstate,
                                   InsertGlobalState &gstate, DataChunk &tuples, const PhysicalInsert &op) {
	auto &types_to_fetch = op.types_to_fetch;
	auto &on_conflict_condition = op.on_conflict_condition;
	auto &conflict_target = op.conflict_target;
	auto &columns_to_fetch = op.columns_to_fetch;
	auto &data_table = table.GetStorage();

	auto &local_storage = LocalStorage::Get(context.client, data_table.db);

	ConflictInfo conflict_info(conflict_target);
	ConflictManager conflict_manager(VerifyExistenceType::APPEND, tuples.size(), &conflict_info);
	auto storage = local_storage.GetStorage(data_table);
	if (GLOBAL) {
		auto &constraint_state = lstate.GetConstraintState(data_table, table);
		data_table.VerifyAppendConstraints(constraint_state, context.client, tuples, storage, &conflict_manager);
	} else {
		auto &indexes = local_storage.GetIndexes(context.client, data_table);
		DataTable::VerifyUniqueIndexes(indexes, storage, tuples, &conflict_manager);
	}

	conflict_manager.Finalize();
	if (conflict_manager.ConflictCount() == 0) {
		// No conflicts found, 0 updates performed
		return 0;
	}
	idx_t affected_tuples = 0;

	auto &conflicts = conflict_manager.Conflicts();
	auto &row_ids = conflict_manager.RowIds();

	DataChunk conflict_chunk; // contains only the conflicting values
	DataChunk scan_chunk;     // contains the original values, that caused the conflict
	DataChunk combined_chunk; // contains conflict_chunk + scan_chunk (wide)

	// Filter out everything but the conflicting rows
	conflict_chunk.Initialize(context.client, tuples.GetTypes());
	conflict_chunk.Reference(tuples);
	conflict_chunk.Slice(conflicts.Selection(), conflicts.Count());
	conflict_chunk.SetCardinality(conflicts.Count());

	// Holds the pins for the fetched rows
	unique_ptr<ColumnFetchState> fetch_state;
	if (!types_to_fetch.empty()) {
		D_ASSERT(scan_chunk.size() == 0);
		// When these values are required for the conditions or the SET expressions,
		// then we scan the existing table for the conflicting tuples, using the rowids
		scan_chunk.Initialize(context.client, types_to_fetch);
		fetch_state = make_uniq<ColumnFetchState>();
		if (GLOBAL) {
			auto &transaction = DuckTransaction::Get(context.client, table.catalog);
			data_table.Fetch(transaction, scan_chunk, columns_to_fetch, row_ids, conflicts.Count(), *fetch_state);
		} else {
			local_storage.FetchChunk(data_table, row_ids, conflicts.Count(), columns_to_fetch, scan_chunk,
			                         *fetch_state);
		}
	}

	// Splice the Input chunk and the fetched chunk together
	CombineExistingAndInsertTuples(combined_chunk, scan_chunk, conflict_chunk, context.client, op);

	auto &constraint_state = lstate.GetConstraintState(data_table, table);
	VerifyOnConflictCondition<GLOBAL>(context, combined_chunk, on_conflict_condition, constraint_state, tuples,
	                                  data_table, local_storage);

	if (&tuples == &lstate.update_chunk) {
		// Allow updating duplicate rows for the 'update_chunk'
		RegisterUpdatedRows(lstate, row_ids, combined_chunk.size());
	}

	affected_tuples += PerformOnConflictAction<GLOBAL>(lstate, gstate, context, combined_chunk, table, row_ids, op);

	// Remove the conflicting tuples from the insert chunk
	SelectionVector sel_vec(tuples.size());
	idx_t new_size = SelectionVector::Inverted(conflicts.Selection(), sel_vec, conflicts.Count(), tuples.size());
	tuples.Slice(sel_vec, new_size);
	tuples.SetCardinality(new_size);
	return affected_tuples;
}